

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O2

void visit_function_decl(gvisitor_t *self,gnode_function_decl_t *node)

{
  uint uVar1;
  gnode_compound_stmt_t *pgVar2;
  _Bool _Var3;
  uint32_t uVar4;
  undefined8 in_RAX;
  void *pvVar5;
  symboltable_t *table;
  long *plVar6;
  long lVar7;
  uint16_t uVar8;
  size_t _i;
  ulong uVar9;
  long lVar10;
  gnode_t *pgVar11;
  gnode_var_t *p;
  ulong uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  
  pgVar11 = *(gnode_t **)((*self->data)[2] + -8 + **self->data * 8);
  check_access_storage_specifiers(self,&node->base,pgVar11->tag,node->access,node->storage);
  node->env = pgVar11;
  plVar6 = *self->data;
  lVar7 = *plVar6;
  if (lVar7 == plVar6[1]) {
    lVar10 = 8;
    if (lVar7 != 0) {
      lVar10 = lVar7 * 2;
    }
    plVar6[1] = lVar10;
    pvVar5 = realloc((void *)plVar6[2],lVar10 << 3);
    plVar6 = *self->data;
    plVar6[2] = (long)pvVar5;
    lVar7 = *plVar6;
  }
  else {
    pvVar5 = (void *)plVar6[2];
  }
  *plVar6 = lVar7 + 1;
  *(gnode_function_decl_t **)((long)pvVar5 + lVar7 * 8) = node;
  table = symboltable_create(SYMTABLE_TAG_FUNC);
  symboltable_enter_scope(table);
  node->symtable = table;
  if (node->params != (gnode_r *)0x0) {
    uVar12 = node->params->n;
    for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
      if (uVar9 < node->params->n) {
        pgVar11 = node->params->p[uVar9];
      }
      else {
        pgVar11 = (gnode_t *)0x0;
      }
      *(gnode_function_decl_t **)(pgVar11 + 1) = node;
      _Var3 = symboltable_insert(table,*(char **)&pgVar11[1].block_length,pgVar11);
      if (_Var3) {
        uVar4 = symboltable_local_index(table);
        *(short *)&pgVar11[1].token.length = (short)uVar4;
      }
      else {
        report_error(self,GRAVITY_ERROR_SEMANTIC,pgVar11,"Parameter %s redeclared.",
                     *(undefined8 *)&pgVar11[1].block_length);
      }
    }
  }
  uVar14 = (undefined4)((ulong)in_RAX >> 0x20);
  pgVar2 = node->block;
  if (pgVar2 != (gnode_compound_stmt_t *)0x0) {
    if (pgVar2->stmts == (gnode_r *)0x0) {
      uVar12 = 0;
    }
    else {
      uVar12 = pgVar2->stmts->n;
    }
    for (uVar9 = 0; uVar14 = (undefined4)((ulong)in_RAX >> 0x20), uVar12 != uVar9; uVar9 = uVar9 + 1
        ) {
      if (uVar9 < pgVar2->stmts->n) {
        pgVar11 = pgVar2->stmts->p[uVar9];
      }
      else {
        pgVar11 = (gnode_t *)0x0;
      }
      gvisit(self,pgVar11);
    }
  }
  if (node->params == (gnode_r *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (uint16_t)node->params->n;
  }
  uVar4 = symboltable_exit_scope(table,(uint32_t *)0x0);
  if (uVar4 < 0xc9) {
    node->nlocals = (short)uVar4 - uVar8;
    node->nparams = uVar8;
  }
  else {
    uVar13 = CONCAT44(uVar14,uVar4);
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                 "Maximum number of local variables reached in function %s (max:%d found:%d).",
                 node->identifier,200,uVar13);
    uVar14 = (undefined4)((ulong)uVar13 >> 0x20);
  }
  if ((node->uplist != (gupvalue_r *)0x0) && (uVar1 = (uint)node->uplist->n, 200 < uVar1)) {
    report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,
                 "Maximum number of upvalues reached in function %s (max:%d found:%d).",
                 node->identifier,200,CONCAT44(uVar14,uVar1));
  }
  lVar7 = **self->data;
  if (lVar7 != 0) {
    **self->data = lVar7 + -1;
  }
  return;
}

Assistant:

static void visit_function_decl (gvisitor_t *self, gnode_function_decl_t *node) {
    DEBUG_CODEGEN("visit_function_decl %s", node->identifier);

    // extern means it will be provided at runtime by the delegate
    if (node->storage == TOK_KEY_EXTERN) return;

    DECLARE_CONTEXT();
    bool is_class_ctx = OBJECT_ISA_CLASS(context_object);

    // create new function object
    uint16_t nparams = (node->params) ? (uint16_t)marray_size(*node->params) : 0;
    gravity_function_t *f = gravity_function_new((is_class_ctx) ? NULL : GET_VM(), node->identifier,
                                                 nparams, node->nlocals, 0, (void *)ircode_create(node->nlocals+nparams));

    // check if f is a special constructor function (init)
    // name must be CLASS_CONSTRUCTOR_NAME and context_object must be a class
    bool is_constructor = (string_cmp(node->identifier, CLASS_CONSTRUCTOR_NAME) == 0) && (is_class_ctx);

    // loop at each param to save name and check for default values
    // loop from 1 in order to skip implicit self argument
    size_t len = gnode_array_size(node->params);
    for (size_t i=1; i<len; ++i) {
        gnode_var_t *param = (gnode_var_t *)gnode_array_get(node->params, i);
        gravity_value_t name = VALUE_FROM_CSTRING(NULL, param->identifier);
        marray_push(gravity_value_t, f->pname, name);
        
        if (node->has_defaults) {
            // LOOP for each node->params[i]->expr and convert literal to gravity_value_t
            // if expr is NULL then compute value as UNDEFINED (and add each one to f->defaults preserving the index)
            gnode_literal_expr_t *literal = (gnode_literal_expr_t *)param->expr;
            gravity_value_t value = (literal) ? literal2value(literal) : VALUE_FROM_UNDEFINED;
            marray_push(gravity_value_t, f->pvalue, value);
        }
    }
    
    CONTEXT_PUSH(f);

    if (is_constructor) {
        // reserve first four instructions that could be later filled with a CALL to $init
        // see process_constructor for more information
        ircode_t *code = (ircode_t *)f->bytecode;
        if (!code) {report_error(self, (gnode_t *)node, "Invalid code context."); return;}
		ircode_add_skip(code, LINE_NUMBER(node));
		ircode_add_skip(code, LINE_NUMBER(node));
		ircode_add_skip(code, LINE_NUMBER(node));
		ircode_add_skip(code, LINE_NUMBER(node));
    }

    // process inner block
    ircode_t *code = (ircode_t *)f->bytecode;
    if (node->block) {
        gnode_array_each(node->block->stmts, {
            // process node
            visit(val);
            // reset temp registers after each node
            ircode_register_temps_clear(code);
        });
    }

    // check for upvalues
    if (node->uplist) f->nupvalues = (uint16_t)gnode_array_size(node->uplist);

    // remove current function
    CONTEXT_POP();

    // check for ircode errors
    if (ircode_iserror((ircode_t *)f->bytecode))
        report_error(self, (gnode_t *)node, "Maximum number of available registers used in function %s.", f->identifier);

    // store function in current context
    store_declaration(self, (gravity_object_t *)f, (node->storage == TOK_KEY_STATIC), node);

    // convert ircode to bytecode (postpone optimization of the constructor)
	if (!is_constructor) gravity_optimizer(f, self->bflag);
}